

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O2

void __thiscall UnifiedRegex::AltNode::Emit(AltNode *this,Compiler *compiler,CharCount *skipped)

{
  byte bVar1;
  uint uVar2;
  RuntimeCharTrie *pRVar3;
  size_t sVar4;
  code *pcVar5;
  RuntimeCharTrieEntry *pRVar6;
  bool bVar7;
  char16 cVar8;
  uint uVar9;
  int iVar10;
  Label LVar11;
  Label LVar12;
  int iVar13;
  AltNode *curr;
  undefined4 *puVar14;
  AltNode *pAVar15;
  uint8 *puVar16;
  TryMatchSetInst *this_00;
  TryIfSetInst *this_01;
  uint *puVar17;
  MatchSetOrJumpInst *this_02;
  uint *puVar18;
  SwitchAndConsume2Inst *pSVar19;
  SwitchAndConsume4Inst *pSVar20;
  SwitchAndConsume8Inst *pSVar21;
  SwitchAndConsume16Inst *pSVar22;
  SwitchAndConsume24Inst *pSVar23;
  OptMatchSetInst *this_03;
  Switch4Inst *this_04;
  Switch8Inst *this_05;
  Switch16Inst *this_06;
  Switch24Inst *this_07;
  long lVar24;
  AltNode *pAVar25;
  ulong uVar26;
  JumpMixin *pLabel;
  Node *pNVar27;
  Compiler *pCVar28;
  int iVar29;
  uint uVar30;
  TryMixin *pTVar31;
  AltNode *curr_1;
  ulong uVar32;
  Label local_68;
  undefined4 *local_60;
  Char local_48 [4];
  CharCount itemSkipped;
  Compiler *local_38;
  
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  local_38 = compiler;
  if (*skipped != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0xa42,"(skipped == 0)","skipped == 0");
    if (!bVar7) goto LAB_00d141c4;
    *puVar14 = 0;
  }
  pCVar28 = local_38;
  _itemSkipped = this;
  switch(this->scheme) {
  case Try:
    if (this->isOptional == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xa53,"(!isOptional)","!isOptional");
      if (!bVar7) goto LAB_00d141c4;
      *puVar14 = 0;
    }
    iVar29 = -1;
    for (pAVar15 = this; pAVar15 != (AltNode *)0x0; pAVar15 = pAVar15->tail) {
      iVar29 = iVar29 + 1;
    }
    if (iVar29 + 1 < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xa57,"(numItems >= 1)","numItems >= 1");
      if (!bVar7) goto LAB_00d141c4;
      *puVar14 = 0;
    }
    iVar13 = 0;
    puVar17 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_int,false>
                        ((Memory *)local_38->ctAllocator,
                         (ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,(long)iVar29);
    LVar11 = 0;
    for (; pCVar28 = local_38, this != (AltNode *)0x0; this = this->tail) {
      if (0 < iVar13) {
        Compiler::DoFixup(local_38,LVar11,local_38->instNext);
      }
      local_48[0] = L'\0';
      local_48[1] = L'\0';
      if (iVar13 < iVar29) {
        pNVar27 = this->head;
        if ((pNVar27->firstSet == (CharSet<char16_t> *)0x0) || ((pNVar27->thisConsumes).lower == 0))
        {
LAB_00d1370a:
          pCVar28 = local_38;
          puVar16 = Compiler::Emit(local_38,5);
          *puVar16 = ']';
          puVar16[1] = 0xff;
          puVar16[2] = 0xff;
          puVar16[3] = 0xff;
          puVar16[4] = 0xff;
          pTVar31 = (TryMixin *)(puVar16 + 1);
        }
        else {
          if ((pNVar27->field_0xc & 1) == 0) {
            uVar9 = CharSet<char16_t>::Count(pNVar27->firstSet);
            if (0x14 < uVar9) goto LAB_00d1370a;
            pNVar27 = this->head;
          }
          iVar10 = (*pNVar27->_vptr_Node[0xb])(pNVar27,local_38);
          pCVar28 = local_38;
          sVar4 = (this->head->firstSet->rep).compact.countPlusOne;
          _itemSkipped = this;
          if ((char)iVar10 != '\0') {
            if (sVar4 == 2) {
              puVar16 = Compiler::Emit(local_38,7);
              cVar8 = CharSet<char16_t>::Singleton(_itemSkipped->head->firstSet);
              *puVar16 = '_';
              *(char16 *)(puVar16 + 1) = cVar8;
              puVar16[3] = 0xff;
              puVar16[4] = 0xff;
              puVar16[5] = 0xff;
              puVar16[6] = 0xff;
              pTVar31 = (TryMixin *)(puVar16 + 3);
            }
            else {
              this_00 = (TryMatchSetInst *)Compiler::Emit(local_38,0x2d);
              TryMatchSetInst::TryMatchSetInst(this_00);
              RuntimeCharSet<char16_t>::CloneFrom
                        (&(this_00->super_SetMixin<false>).set,pCVar28->rtAllocator,
                         _itemSkipped->head->firstSet);
              pTVar31 = &this_00->super_TryMixin;
            }
            LVar11 = Compiler::GetFixup(pCVar28,&pTVar31->failLabel);
            local_48[0] = L'\x01';
            local_48[1] = L'\0';
            this = _itemSkipped;
            goto LAB_00d13735;
          }
          if (sVar4 == 2) {
            puVar16 = Compiler::Emit(local_38,7);
            this = _itemSkipped;
            cVar8 = CharSet<char16_t>::Singleton(_itemSkipped->head->firstSet);
            *puVar16 = '^';
            *(char16 *)(puVar16 + 1) = cVar8;
            puVar16[3] = 0xff;
            puVar16[4] = 0xff;
            puVar16[5] = 0xff;
            puVar16[6] = 0xff;
            pTVar31 = (TryMixin *)(puVar16 + 3);
          }
          else {
            this_01 = (TryIfSetInst *)Compiler::Emit(local_38,0x2d);
            TryIfSetInst::TryIfSetInst(this_01);
            this = _itemSkipped;
            RuntimeCharSet<char16_t>::CloneFrom
                      (&(this_01->super_SetMixin<false>).set,pCVar28->rtAllocator,
                       _itemSkipped->head->firstSet);
            pTVar31 = &this_01->super_TryMixin;
          }
        }
        LVar11 = Compiler::GetFixup(pCVar28,&pTVar31->failLabel);
      }
LAB_00d13735:
      (*this->head->_vptr_Node[0x11])(this->head,local_38,local_48);
      pCVar28 = local_38;
      if (iVar13 < iVar29) {
        puVar16 = Compiler::Emit(local_38,5);
        *puVar16 = '\x03';
        puVar16[1] = 0xff;
        puVar16[2] = 0xff;
        puVar16[3] = 0xff;
        puVar16[4] = 0xff;
        LVar12 = Compiler::GetFixup(pCVar28,(Label *)(puVar16 + 1));
        puVar17[iVar13] = LVar12;
      }
      iVar13 = iVar13 + 1;
    }
    for (lVar24 = 0; lVar24 < iVar29; lVar24 = lVar24 + 1) {
      Compiler::DoFixup(pCVar28,puVar17[lVar24],pCVar28->instNext);
    }
    break;
  case None:
    if (this->isOptional == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xa91,"(isOptional)","isOptional");
      if (!bVar7) goto LAB_00d141c4;
      *puVar14 = 0;
    }
    break;
  case Trie:
    pRVar3 = this->runtimeTrie;
    puVar16 = Compiler::Emit(local_38,0x11);
    *puVar16 = '\"';
    puVar16[1] = '\0';
    puVar16[2] = '\0';
    puVar16[3] = '\0';
    puVar16[4] = '\0';
    puVar16[9] = '\0';
    puVar16[10] = '\0';
    puVar16[0xb] = '\0';
    puVar16[0xc] = '\0';
    puVar16[0xd] = '\0';
    puVar16[0xe] = '\0';
    puVar16[0xf] = '\0';
    puVar16[0x10] = '\0';
    pRVar6 = pRVar3->children;
    *(undefined8 *)(puVar16 + 1) = *(undefined8 *)pRVar3;
    *(RuntimeCharTrieEntry **)(puVar16 + 9) = pRVar6;
    break;
  case Switch:
    if (this->switchSize < 0x19) {
      local_60 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      local_60 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *local_60 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xaae,"(switchSize <= Switch24Inst::MaxCases)",
                         "switchSize <= Switch24Inst::MaxCases");
      if (!bVar7) goto LAB_00d141c4;
      *local_60 = 0;
    }
    iVar29 = 0;
    bVar1 = 1;
    for (pAVar15 = _itemSkipped; pCVar28 = local_38, pAVar15 != (AltNode *)0x0;
        pAVar15 = pAVar15->tail) {
      pNVar27 = pAVar15->head;
      if ((pNVar27->thisConsumes).lower == 0) {
        if (_itemSkipped->isOptional == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_60 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                             ,0xab5,"(isOptional)","isOptional");
          if (!bVar7) goto LAB_00d141c4;
          *local_60 = 0;
        }
      }
      else {
        iVar29 = iVar29 + 1;
        iVar13 = (*pNVar27->_vptr_Node[0xb])(pNVar27,local_38);
        bVar1 = bVar1 & (byte)iVar13;
      }
    }
    if (iVar29 < 2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_60 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xac0,"(numItems > 1)","numItems > 1");
      if (!bVar7) goto LAB_00d141c4;
      *local_60 = 0;
    }
    uVar30 = iVar29 - 1;
    puVar17 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_int,false>
                        ((Memory *)pCVar28->ctAllocator,
                         (ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,(long)(int)uVar30);
    puVar18 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_int,false>
                        ((Memory *)pCVar28->ctAllocator,
                         (ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,(long)iVar29);
    pAVar15 = _itemSkipped;
    LVar11 = pCVar28->instNext;
    if (0x18 < _itemSkipped->switchSize) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_60 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xac9,"(switchSize <= Switch24Inst::MaxCases)",
                         "switchSize <= Switch24Inst::MaxCases");
      if (!bVar7) goto LAB_00d141c4;
      *local_60 = 0;
    }
    uVar2 = pAVar15->switchSize;
    if (bVar1 == 0) {
      if ((int)uVar2 < 3) {
        puVar16 = Compiler::Emit(pCVar28,0xe);
        puVar16[0] = '\b';
        puVar16[1] = '\0';
        goto LAB_00d13cfe;
      }
      if (uVar2 < 5) {
        this_04 = (Switch4Inst *)Compiler::Emit(pCVar28,0x1a);
        Switch4Inst::Switch4Inst(this_04);
      }
      else if (uVar2 < 9) {
        this_05 = (Switch8Inst *)Compiler::Emit(pCVar28,0x32);
        Switch8Inst::Switch8Inst(this_05);
      }
      else if (uVar2 < 0x11) {
        this_06 = (Switch16Inst *)Compiler::Emit(pCVar28,0x62);
        Switch16Inst::Switch16Inst(this_06);
      }
      else {
        if (0x18 < uVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_60 = 1;
          uVar9 = 0xafd;
          goto LAB_00d141b2;
        }
        this_07 = (Switch24Inst *)Compiler::Emit(pCVar28,0x92);
        Switch24Inst::Switch24Inst(this_07);
      }
    }
    else if ((int)uVar2 < 3) {
      puVar16 = Compiler::Emit(pCVar28,0xe);
      puVar16[0] = '\r';
      puVar16[1] = '\0';
LAB_00d13cfe:
      puVar16[2] = 0xff;
      puVar16[3] = 0xff;
      puVar16[4] = 0xff;
      puVar16[5] = 0xff;
      puVar16[6] = 0xff;
      puVar16[7] = 0xff;
      puVar16[8] = 0xff;
      puVar16[9] = 0xff;
      puVar16[10] = 0xff;
      puVar16[0xb] = 0xff;
      puVar16[0xc] = 0xff;
      puVar16[0xd] = 0xff;
    }
    else if (uVar2 < 5) {
      pSVar20 = (SwitchAndConsume4Inst *)Compiler::Emit(pCVar28,0x1a);
      SwitchAndConsume4Inst::SwitchAndConsume4Inst(pSVar20);
    }
    else if (uVar2 < 9) {
      pSVar21 = (SwitchAndConsume8Inst *)Compiler::Emit(pCVar28,0x32);
      SwitchAndConsume8Inst::SwitchAndConsume8Inst(pSVar21);
    }
    else if (uVar2 < 0x11) {
      pSVar22 = (SwitchAndConsume16Inst *)Compiler::Emit(pCVar28,0x62);
      SwitchAndConsume16Inst::SwitchAndConsume16Inst(pSVar22);
    }
    else if (uVar2 < 0x19) {
      pSVar23 = (SwitchAndConsume24Inst *)Compiler::Emit(pCVar28,0x92);
      SwitchAndConsume24Inst::SwitchAndConsume24Inst(pSVar23);
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_60 = 1;
      uVar9 = 0xae2;
LAB_00d141b2:
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,uVar9,"(false)",
                         "It should not be possible to reach here. This implies that we entered the Switch layout with greater than the max allowable cases."
                        );
      if (!bVar7) {
LAB_00d141c4:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *local_60 = 0;
    }
    if (pAVar15->isOptional == true) {
      puVar16 = Compiler::Emit(pCVar28,5);
      *puVar16 = '\x03';
      puVar16[1] = 0xff;
      puVar16[2] = 0xff;
      puVar16[3] = 0xff;
      puVar16[4] = 0xff;
      local_68 = Compiler::GetFixup(pCVar28,(Label *)(puVar16 + 1));
    }
    else {
      Compiler::Emit<UnifiedRegex::FailInst>(pCVar28);
      local_68 = 0;
    }
    iVar29 = 0;
    for (pAVar25 = pAVar15; pAVar25 != (AltNode *)0x0; pAVar25 = pAVar25->tail) {
      pNVar27 = pAVar25->head;
      if ((pNVar27->thisConsumes).lower != 0) {
        if (bVar1 != 0) {
          *skipped = 1;
        }
        puVar18[iVar29] = pCVar28->instNext;
        (*pNVar27->_vptr_Node[0x11])(pNVar27,pCVar28,skipped);
        pCVar28 = local_38;
        if (iVar29 < (int)uVar30) {
          puVar16 = Compiler::Emit(local_38,5);
          pAVar15 = _itemSkipped;
          *puVar16 = '\x03';
          puVar16[1] = 0xff;
          puVar16[2] = 0xff;
          puVar16[3] = 0xff;
          puVar16[4] = 0xff;
          LVar12 = Compiler::GetFixup(pCVar28,(Label *)(puVar16 + 1));
          puVar17[iVar29] = LVar12;
        }
        iVar29 = iVar29 + 1;
        pCVar28 = local_38;
      }
    }
    if (pAVar15->isOptional != false) {
      Compiler::DoFixup(pCVar28,local_68,pCVar28->instNext);
    }
    uVar26 = 0;
    uVar32 = (ulong)uVar30;
    if ((int)uVar30 < 1) {
      uVar32 = uVar26;
    }
    for (; uVar32 != uVar26; uVar26 = uVar26 + 1) {
      Compiler::DoFixup(pCVar28,puVar17[uVar26],pCVar28->instNext);
    }
    iVar29 = 0;
    for (pAVar15 = _itemSkipped; pAVar15 != (AltNode *)0x0; pAVar15 = pAVar15->tail) {
      if ((pAVar15->head->thisConsumes).lower != 0) {
        uVar30 = CharSet<char16_t>::GetCompactEntries(pAVar15->head->firstSet,4,local_48);
        if ((int)uVar30 < 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_60 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                             ,0xb33,"(count > 0)","count > 0");
          if (!bVar7) goto LAB_00d141c4;
          *local_60 = 0;
        }
        if ((int)uVar30 < 1) {
          uVar30 = 0;
        }
        for (uVar32 = 0; uVar30 != uVar32; uVar32 = uVar32 + 1) {
          uVar2 = _itemSkipped->switchSize;
          if (bVar1 == 0) {
            if ((int)uVar2 < 3) {
              pSVar19 = (SwitchAndConsume2Inst *)
                        Compiler::LabelToInstPointer<UnifiedRegex::Switch2Inst>
                                  (local_38,Switch2,LVar11);
              goto LAB_00d13ed4;
            }
            if (uVar2 < 5) {
              pSVar20 = (SwitchAndConsume4Inst *)
                        Compiler::LabelToInstPointer<UnifiedRegex::Switch4Inst>
                                  (local_38,Switch4,LVar11);
              goto LAB_00d13f16;
            }
            if (uVar2 < 9) {
              pSVar21 = (SwitchAndConsume8Inst *)
                        Compiler::LabelToInstPointer<UnifiedRegex::Switch8Inst>
                                  (local_38,Switch8,LVar11);
              goto LAB_00d13f58;
            }
            if (uVar2 < 0x11) {
              pSVar22 = (SwitchAndConsume16Inst *)
                        Compiler::LabelToInstPointer<UnifiedRegex::Switch16Inst>
                                  (local_38,Switch16,LVar11);
              goto LAB_00d13f97;
            }
            if (uVar2 < 0x19) {
              pSVar23 = (SwitchAndConsume24Inst *)
                        Compiler::LabelToInstPointer<UnifiedRegex::Switch24Inst>
                                  (local_38,Switch24,LVar11);
              goto LAB_00d13fd6;
            }
          }
          else if ((int)uVar2 < 3) {
            pSVar19 = Compiler::LabelToInstPointer<UnifiedRegex::SwitchAndConsume2Inst>
                                (local_38,SwitchAndConsume2,LVar11);
LAB_00d13ed4:
            SwitchMixin<(unsigned_char)'\x02'>::AddCase
                      (&pSVar19->super_SwitchMixin<(unsigned_char)__x02_>,local_48[uVar32],
                       puVar18[iVar29]);
          }
          else if (uVar2 < 5) {
            pSVar20 = Compiler::LabelToInstPointer<UnifiedRegex::SwitchAndConsume4Inst>
                                (local_38,SwitchAndConsume4,LVar11);
LAB_00d13f16:
            SwitchMixin<(unsigned_char)'\x04'>::AddCase
                      (&pSVar20->super_SwitchMixin<(unsigned_char)__x04_>,local_48[uVar32],
                       puVar18[iVar29]);
          }
          else if (uVar2 < 9) {
            pSVar21 = Compiler::LabelToInstPointer<UnifiedRegex::SwitchAndConsume8Inst>
                                (local_38,SwitchAndConsume8,LVar11);
LAB_00d13f58:
            SwitchMixin<(unsigned_char)'\b'>::AddCase
                      (&pSVar21->super_SwitchMixin<(unsigned_char)__b_>,local_48[uVar32],
                       puVar18[iVar29]);
          }
          else if (uVar2 < 0x11) {
            pSVar22 = Compiler::LabelToInstPointer<UnifiedRegex::SwitchAndConsume16Inst>
                                (local_38,SwitchAndConsume16,LVar11);
LAB_00d13f97:
            SwitchMixin<(unsigned_char)'\x10'>::AddCase
                      (&pSVar22->super_SwitchMixin<(unsigned_char)__x10_>,local_48[uVar32],
                       puVar18[iVar29]);
          }
          else if (uVar2 < 0x19) {
            pSVar23 = Compiler::LabelToInstPointer<UnifiedRegex::SwitchAndConsume24Inst>
                                (local_38,SwitchAndConsume24,LVar11);
LAB_00d13fd6:
            SwitchMixin<(unsigned_char)'\x18'>::AddCase
                      (&pSVar23->super_SwitchMixin<(unsigned_char)__x18_>,local_48[uVar32],
                       puVar18[iVar29]);
          }
        }
        iVar29 = iVar29 + 1;
      }
    }
    break;
  case Chain:
    iVar29 = 0;
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    for (; this != (AltNode *)0x0; this = this->tail) {
      if ((this->head->thisConsumes).lower == 0) {
        if (_itemSkipped->isOptional == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                             ,0xb7f,"(isOptional)","isOptional");
          if (!bVar7) goto LAB_00d141c4;
          *puVar14 = 0;
        }
      }
      else {
        iVar29 = iVar29 + 1;
      }
    }
    if (iVar29 < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xb84,"(numItems > 0)","numItems > 0");
      if (!bVar7) goto LAB_00d141c4;
      *puVar14 = 0;
    }
    pCVar28 = local_38;
    uVar30 = iVar29 - 1;
    LVar11 = 0;
    puVar17 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_int,false>
                        ((Memory *)local_38->ctAllocator,
                         (ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,(long)(int)uVar30);
    iVar29 = 0;
    pAVar25 = _itemSkipped;
    for (pAVar15 = _itemSkipped; pAVar15 != (AltNode *)0x0; pAVar15 = pAVar15->tail) {
      if ((pAVar15->head->thisConsumes).lower != 0) {
        local_38 = (Compiler *)CONCAT44(local_38._4_4_,iVar29);
        if (0 < iVar29) {
          Compiler::DoFixup(pCVar28,LVar11,pCVar28->instNext);
          iVar29 = (int)local_38;
        }
        local_48[0] = L'\0';
        local_48[1] = L'\0';
        if ((iVar29 < (int)uVar30) || (pAVar25->isOptional == true)) {
          pNVar27 = pAVar15->head;
          sVar4 = (pNVar27->firstSet->rep).compact.countPlusOne;
          iVar29 = (*pNVar27->_vptr_Node[0xb])(pNVar27,pCVar28);
          if (sVar4 == 2) {
            puVar16 = Compiler::Emit(pCVar28,7);
            cVar8 = CharSet<char16_t>::Singleton(pAVar15->head->firstSet);
            pLabel = (JumpMixin *)(puVar16 + 3);
            if ((char)iVar29 != '\0') {
              *puVar16 = '\x05';
              *(char16 *)(puVar16 + 1) = cVar8;
              puVar16[3] = 0xff;
              puVar16[4] = 0xff;
              puVar16[5] = 0xff;
              puVar16[6] = 0xff;
LAB_00d139e6:
              LVar11 = Compiler::GetFixup(pCVar28,&pLabel->targetLabel);
              local_48[0] = L'\x01';
              local_48[1] = L'\0';
              pAVar25 = _itemSkipped;
              goto LAB_00d13a3c;
            }
            *puVar16 = '\x04';
            *(char16 *)(puVar16 + 1) = cVar8;
            puVar16[3] = 0xff;
            puVar16[4] = 0xff;
            puVar16[5] = 0xff;
            puVar16[6] = 0xff;
          }
          else {
            this_02 = (MatchSetOrJumpInst *)Compiler::Emit(pCVar28,0x2d);
            pLabel = &this_02->super_JumpMixin;
            if ((char)iVar29 != '\0') {
              MatchSetOrJumpInst::MatchSetOrJumpInst(this_02);
              RuntimeCharSet<char16_t>::CloneFrom
                        (&(this_02->super_SetMixin<false>).set,pCVar28->rtAllocator,
                         pAVar15->head->firstSet);
              goto LAB_00d139e6;
            }
            JumpIfNotSetInst::JumpIfNotSetInst((JumpIfNotSetInst *)this_02);
            RuntimeCharSet<char16_t>::CloneFrom
                      (&(this_02->super_SetMixin<false>).set,pCVar28->rtAllocator,
                       pAVar15->head->firstSet);
          }
          LVar11 = Compiler::GetFixup(pCVar28,&pLabel->targetLabel);
          pAVar25 = _itemSkipped;
        }
LAB_00d13a3c:
        (*pAVar15->head->_vptr_Node[0x11])(pAVar15->head,pCVar28,local_48);
        if ((int)local_38 < (int)uVar30) {
          puVar16 = Compiler::Emit(pCVar28,5);
          *puVar16 = '\x03';
          puVar16[1] = 0xff;
          puVar16[2] = 0xff;
          puVar16[3] = 0xff;
          puVar16[4] = 0xff;
          LVar12 = Compiler::GetFixup(pCVar28,(Label *)(puVar16 + 1));
          puVar17[(int)local_38] = LVar12;
        }
        iVar29 = (int)local_38 + 1;
      }
    }
    uVar26 = 0;
    uVar32 = (ulong)uVar30;
    if ((int)uVar30 < 1) {
      uVar32 = uVar26;
    }
    for (; uVar32 != uVar26; uVar26 = uVar26 + 1) {
      Compiler::DoFixup(pCVar28,puVar17[uVar26],pCVar28->instNext);
    }
    if (_itemSkipped->isOptional == true) {
      Compiler::DoFixup(pCVar28,LVar11,pCVar28->instNext);
    }
    break;
  case Set:
    sVar4 = (((this->super_Node).firstSet)->rep).compact.countPlusOne;
    if (this->isOptional == true) {
      if (sVar4 != 2) {
        this_03 = (OptMatchSetInst *)Compiler::Emit(local_38,0x29);
        OptMatchSetInst::OptMatchSetInst(this_03);
LAB_00d14039:
        RuntimeCharSet<char16_t>::CloneFrom
                  (&(this_03->super_SetMixin<false>).set,pCVar28->rtAllocator,
                   (_itemSkipped->super_Node).firstSet);
        return;
      }
      puVar16 = Compiler::Emit(local_38,3);
      cVar8 = CharSet<char16_t>::Singleton((_itemSkipped->super_Node).firstSet);
      *puVar16 = '#';
    }
    else {
      if (sVar4 != 2) {
        this_03 = (OptMatchSetInst *)Compiler::Emit(local_38,0x29);
        MatchSetInst<false>::MatchSetInst((MatchSetInst<false> *)this_03);
        goto LAB_00d14039;
      }
      puVar16 = Compiler::Emit(local_38,3);
      cVar8 = CharSet<char16_t>::Singleton((_itemSkipped->super_Node).firstSet);
      *puVar16 = '\x1a';
    }
    *(char16 *)(puVar16 + 1) = cVar8;
  }
  return;
}

Assistant:

void AltNode::Emit(Compiler& compiler, CharCount& skipped)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        Assert(skipped == 0);
        switch (scheme)
        {
            case Try:
                {
                    //
                    // Compilation scheme:
                    //
                    //          Try((If|Match)(Char|Set))? L2
                    //          <item 1>
                    //          Jump Lexit
                    //   L2:    Try((If|Match)(Char|Set))? L3
                    //          <item 2>
                    //          Jump Lexit
                    //   L3:    <item 3>
                    //   Lexit:
                    //
                    Assert(!isOptional);
                    int numItems = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                        numItems++;
                    Assert(numItems >= 1);
                    // Each item other than last needs to jump to exit on success
                    Label* jumpFixups = AnewArray(compiler.ctAllocator, Label, (numItems - 1));
                    Label lastTryFixup = 0;
                    int item = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail, item++)
                    {
                        if (item > 0)
                            // Fixup previous Try
                            compiler.DoFixup(lastTryFixup, compiler.CurrentLabel());
                        CharCount itemSkipped = 0;
                        if (item < numItems-1)
                        {
                            // HEURISTIC: if the first set of the alternative is exact or small, and the
                            //            alternative does not match empty, then it's probably worth using
                            //            a Try(If|Match)(Char|Set)
                            if (curr->head->firstSet != 0 &&
                                !curr->head->thisConsumes.CouldMatchEmpty() &&
                                (curr->head->isFirstExact || curr->head->firstSet->Count() <= maxCharsForConditionalTry))
                            {
                                if (curr->head->SupportsPrefixSkipping(compiler))
                                {
                                    if (curr->head->firstSet->IsSingleton())
                                        lastTryFixup = compiler.GetFixup(&EMIT(compiler, TryMatchCharInst, curr->head->firstSet->Singleton())->failLabel);
                                    else
                                    {
                                        TryMatchSetInst* const i = EMIT(compiler, TryMatchSetInst);
                                        i->set.CloneFrom(compiler.rtAllocator, *curr->head->firstSet);
                                        lastTryFixup = compiler.GetFixup(&i->failLabel);
                                    }
                                    itemSkipped = 1;
                                }
                                else
                                {
                                    if (curr->head->firstSet->IsSingleton())
                                        lastTryFixup = compiler.GetFixup(&EMIT(compiler, TryIfCharInst, curr->head->firstSet->Singleton())->failLabel);
                                    else
                                    {
                                        TryIfSetInst* const i = EMIT(compiler, TryIfSetInst);
                                        i->set.CloneFrom(compiler.rtAllocator, *curr->head->firstSet);
                                        lastTryFixup = compiler.GetFixup(&i->failLabel);
                                    }
                                }
                            }
                            else
                                lastTryFixup = compiler.GetFixup(&EMIT(compiler, TryInst)->failLabel);
                        }
                        curr->head->Emit(compiler, itemSkipped);
                        if (item < numItems-1)
                            jumpFixups[item] = compiler.GetFixup(&EMIT(compiler, JumpInst)->targetLabel);
                    }
                    // Fixup jumps
                    for (item = 0; item < numItems-1; item++)
                        compiler.DoFixup(jumpFixups[item], compiler.CurrentLabel());
                    break;
                }
            case None:
                {
                    Assert(isOptional);
                    // Nothing to emit
                    break;
                }
            case Trie:
                {
                    //
                    // Compilation scheme:
                    //
                    //     MatchTrie <trie>
                    //
                    EMIT(compiler, MatchTrieInst)->trie = *runtimeTrie;
                    break;
                }
            case Switch:
                {
                    //
                    // Compilation scheme:
                    //
                    //            Switch(AndConsume)?(2|4|8|16|24)(<dispatch to each arm>)
                    //            Fail                                (if non-optional)
                    //            Jump Lexit                          (if optional)
                    //     L1:    <item1>
                    //            Jump Lexit
                    //     L2:    <item2>
                    //            Jump Lexit
                    //     L3:    <item3>
                    //     Lexit:
                    //
                    Assert(switchSize <= Switch24Inst::MaxCases);
                    int numItems = 0;
                    bool allCanSkip = true;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                    {
                        if (curr->head->thisConsumes.CouldMatchEmpty())
                        {
                            Assert(isOptional);
                        }
                        else
                        {
                            numItems++;
                            if (!curr->head->SupportsPrefixSkipping(compiler))
                            {
                                allCanSkip = false;
                            }
                        }
                    }
                    Assert(numItems > 1);

                    // Each item other than last needs to jump to exit on success
                    Label* jumpFixups = AnewArray(compiler.ctAllocator, Label, (numItems - 1));
                    // We must remember where each item begins to fixup switch
                    Label* caseLabels = AnewArray(compiler.ctAllocator, Label, numItems);
                    // We must fixup the switch arms
                    Label switchLabel = compiler.CurrentLabel();

                    Assert(switchSize <= Switch24Inst::MaxCases);
                    if (allCanSkip)
                    {
                        if (switchSize <= Switch2Inst::MaxCases)
                        {
                            EMIT(compiler, SwitchAndConsume2Inst);
                        }
                        else if (switchSize <= Switch4Inst::MaxCases)
                        {
                            EMIT(compiler, SwitchAndConsume4Inst);
                        }
                        else if (switchSize <= Switch8Inst::MaxCases)
                        {
                            EMIT(compiler, SwitchAndConsume8Inst);
                        }
                        else if (switchSize <= Switch16Inst::MaxCases)
                        {
                            EMIT(compiler, SwitchAndConsume16Inst);
                        }
                        else if (switchSize <= Switch24Inst::MaxCases)
                        {
                            EMIT(compiler, SwitchAndConsume24Inst);
                        }
                        else
                        {
                            AssertOrFailFastMsg(false, "It should not be possible to reach here. This implies that we entered the Switch layout with greater than the max allowable cases.");
                        }
                    }
                    else
                    {
                        if (switchSize <= Switch2Inst::MaxCases)
                        {
                            EMIT(compiler, Switch2Inst);
                        }
                        else if (switchSize <= Switch4Inst::MaxCases)
                        {
                            EMIT(compiler, Switch4Inst);
                        }
                        else if (switchSize <= Switch8Inst::MaxCases)
                        {
                            EMIT(compiler, Switch8Inst);
                        }
                        else if (switchSize <= Switch16Inst::MaxCases)
                        {
                            EMIT(compiler, Switch16Inst);
                        }
                        else if (switchSize <= Switch24Inst::MaxCases)
                        {
                            EMIT(compiler, Switch24Inst);
                        }
                        else
                        {
                            AssertOrFailFastMsg(false, "It should not be possible to reach here. This implies that we entered the Switch layout with greater than the max allowable cases.");
                        }
                    }

                    Label defaultJumpFixup = 0;
                    if (isOptional)
                    {
                        // Must fixup default jump to exit
                        defaultJumpFixup = compiler.GetFixup(&EMIT(compiler, JumpInst)->targetLabel);
                    }
                    else
                    {
                        compiler.Emit<FailInst>();
                    }

                    // Emit each item
                    int item = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                    {
                        if (!curr->head->thisConsumes.CouldMatchEmpty())
                        {
                            if (allCanSkip)
                            {
                                skipped = 1;
                            }
                            caseLabels[item] = compiler.CurrentLabel();
                            curr->head->Emit(compiler, skipped);
                            if (item < numItems - 1)
                            {
                                jumpFixups[item] = compiler.GetFixup(&EMIT(compiler, JumpInst)->targetLabel);
                            }
                            item++;
                        }
                    }

                    // Fixup exit labels
                    if (isOptional)
                    {
                        compiler.DoFixup(defaultJumpFixup, compiler.CurrentLabel());
                    }

                    for (item = 0; item < numItems - 1; item++)
                    {
                        compiler.DoFixup(jumpFixups[item], compiler.CurrentLabel());
                    }

                    // Fixup the switch entries
                    item = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                    {
                        if (!curr->head->thisConsumes.CouldMatchEmpty())
                        {
                            Char entries[CharSet<Char>::MaxCompact];
                            int count = curr->head->firstSet->GetCompactEntries(CharSet<Char>::MaxCompact, entries);
                            Assert(count > 0);
                            for (int i = 0; i < count; i++)
                            {
                                if (allCanSkip)
                                {
                                    if (switchSize <= Switch2Inst::MaxCases)
                                    {
                                        compiler.L2I(SwitchAndConsume2, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch4Inst::MaxCases)
                                    {
                                        compiler.L2I(SwitchAndConsume4, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch8Inst::MaxCases)
                                    {
                                        compiler.L2I(SwitchAndConsume8, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch16Inst::MaxCases)
                                    {
                                        compiler.L2I(SwitchAndConsume16, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch24Inst::MaxCases)
                                    {
                                        compiler.L2I(SwitchAndConsume24, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                }
                                else
                                {
                                    if (switchSize <= Switch2Inst::MaxCases)
                                    {
                                        compiler.L2I(Switch2, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch4Inst::MaxCases)
                                    {
                                        compiler.L2I(Switch4, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch8Inst::MaxCases)
                                    {
                                        compiler.L2I(Switch8, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch16Inst::MaxCases)
                                    {
                                        compiler.L2I(Switch16, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch24Inst::MaxCases)
                                    {
                                        compiler.L2I(Switch24, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                }
                            }
                            item++;
                        }
                    }
                    break;
                }
            case Chain:
                {
                    //
                    // Compilation scheme:
                    //
                    //           JumpIfNot(Char|Set) L2
                    //           <item1>
                    //           Jump Lexit
                    //    L2:    JumpIfNot(Char|Set) L3
                    //           <item2>
                    //           Jump Lexit
                    //    L3:    <item3>                              (if non-optional)
                    //    L3:    JumpIfNot(Char|Set) Lexit            (if optional)
                    //           <item3>                              (if optional)
                    //    Lexit:
                    //
                    int numItems = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                    {
                        if (curr->head->thisConsumes.CouldMatchEmpty())
                        {
                            Assert(isOptional);
                        }
                        else
                            numItems++;
                    }
                    Assert(numItems > 0);
                    // Each item other than last needs to jump to exit on success
                    Label* jumpFixups = AnewArray(compiler.ctAllocator, Label, (numItems - 1));
                    Label lastJumpFixup = 0;
                    int item = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                    {
                        if (!curr->head->thisConsumes.CouldMatchEmpty())
                        {
                            if (item > 0)
                                // Fixup previous Jump
                                compiler.DoFixup(lastJumpFixup, compiler.CurrentLabel());

                            CharCount itemSkipped = 0;
                            if (item < numItems-1 || isOptional)
                            {
                                if (curr->head->firstSet->IsSingleton())
                                {
                                    if (curr->head->SupportsPrefixSkipping(compiler))
                                    {
                                        lastJumpFixup = compiler.GetFixup(&EMIT(compiler, MatchCharOrJumpInst, curr->head->firstSet->Singleton())->targetLabel);
                                        itemSkipped = 1;
                                    }
                                    else
                                        lastJumpFixup = compiler.GetFixup(&EMIT(compiler, JumpIfNotCharInst, curr->head->firstSet->Singleton())->targetLabel);
                                }
                                else
                                {
                                    if (curr->head->SupportsPrefixSkipping(compiler))
                                    {
                                        MatchSetOrJumpInst* const i = EMIT(compiler, MatchSetOrJumpInst);
                                        i->set.CloneFrom(compiler.rtAllocator, *curr->head->firstSet);
                                        lastJumpFixup = compiler.GetFixup(&i->targetLabel);
                                        itemSkipped = 1;
                                    }
                                    else
                                    {
                                        JumpIfNotSetInst* const i = EMIT(compiler, JumpIfNotSetInst);
                                        i->set.CloneFrom(compiler.rtAllocator, *curr->head->firstSet);
                                        lastJumpFixup = compiler.GetFixup(&i->targetLabel);
                                    }
                                }
                            }
                            curr->head->Emit(compiler, itemSkipped);
                            if (item < numItems-1)
                                jumpFixups[item] = compiler.GetFixup(&EMIT(compiler, JumpInst)->targetLabel);
                            item++;
                        }
                    }
                    // Fixup jumps to exit
                    for (item = 0; item < numItems-1; item++)
                        compiler.DoFixup(jumpFixups[item], compiler.CurrentLabel());
                    if (isOptional)
                        // Fixup last Jump to exit
                        compiler.DoFixup(lastJumpFixup, compiler.CurrentLabel());
                    break;
                }
            case Set:
                {
                    //
                    // Compilation scheme:
                    //
                    //          Match(Char|Set)    (non optional)
                    //          OptMatch(Char|Set) (optional)
                    //
                    if (isOptional)
                    {
                        if (firstSet->IsSingleton())
                            EMIT(compiler, OptMatchCharInst, firstSet->Singleton());
                        else
                            EMIT(compiler, OptMatchSetInst)->set.CloneFrom(compiler.rtAllocator, *firstSet);
                    }
                    else
                    {
                        if (firstSet->IsSingleton())
                            EMIT(compiler, MatchCharInst, firstSet->Singleton());
                        else
                            EMIT(compiler, MatchSetInst<false>)->set.CloneFrom(compiler.rtAllocator, *firstSet);
                    }
                    break;
                }
        }
    }